

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O2

int __thiscall libtorrent::settings_pack::get_int(settings_pack *this,int name)

{
  __normal_iterator<const_std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
  __last;
  int iVar1;
  __normal_iterator<const_std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
  _Var2;
  int *piVar3;
  pair<unsigned_short,_int> v;
  pair<unsigned_short,_int> local_18;
  
  iVar1 = 0;
  if ((name & 0xc000U) == 0x4000) {
    _Var2._M_current =
         (this->m_ints).
         super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (this->m_ints).
         super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if ((long)__last._M_current - (long)_Var2._M_current == 0x4f8) {
      iVar1 = _Var2._M_current[name & 0x3fff].second;
    }
    else {
      local_18._2_6_ = 0;
      local_18.first = (ushort)name;
      _Var2 = ::std::
              __lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_short,int>const*,std::vector<std::pair<unsigned_short,int>,std::allocator<std::pair<unsigned_short,int>>>>,std::pair<unsigned_short,int>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<unsigned_short,int>const&,std::pair<unsigned_short,int>const&)>>
                        (_Var2,__last,&local_18,
                         (_Iter_comp_val<bool_(*)(const_std::pair<unsigned_short,_int>_&,_const_std::pair<unsigned_short,_int>_&)>
                          )0x2bf1bb);
      if ((_Var2._M_current ==
           (this->m_ints).
           super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) || ((uint)(_Var2._M_current)->first != name))
      {
        piVar3 = (int *)(&DAT_004ce218 + ((name & 0x3fffU) << 5));
      }
      else {
        piVar3 = &(_Var2._M_current)->second;
      }
      iVar1 = *piVar3;
    }
  }
  return iVar1;
}

Assistant:

int settings_pack::get_int(int name) const
	{
		TORRENT_ASSERT_PRECOND((name & type_mask) == int_type_base);
		if ((name & type_mask) != int_type_base) return 0;

		// this is an optimization. If the settings pack is complete,
		// i.e. has every key, we don't need to search, it's just a lookup
		if (m_ints.size() == settings_pack::num_int_settings)
		{
			TORRENT_ASSERT(m_ints[name & index_mask].first == name);
			return m_ints[name & index_mask].second;
		}
		std::pair<std::uint16_t, int> v(aux::numeric_cast<std::uint16_t>(name), 0);
		auto i = std::lower_bound(m_ints.begin(), m_ints.end(), v
				, &compare_first<int>);
		if (i != m_ints.end() && i->first == name) return i->second;

		return int_settings[name & index_mask].default_value;
	}